

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsFunction.hpp
# Opt level: O1

void __thiscall
webfront::
JsFunction<webfront::BasicWF<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::JasmineFS>>>
::operator()(void *this,char (*ts) [12],int *ts_1)

{
  FunctionCall *this_00;
  mapped_type *this_01;
  span<const_std::byte,_18446744073709551615UL> dataHead;
  Frame<webfront::networking::TCPNetworkingTS> frame;
  key_type local_7a;
  Frame<webfront::networking::TCPNetworkingTS> local_78;
  Frame<webfront::networking::TCPNetworkingTS> local_50;
  
  this_00 = (FunctionCall *)((long)this + 0x30);
  *(undefined1 *)((long)this + 0x31) = 0;
  dataHead._M_extent._M_extent_value = 8;
  dataHead._M_ptr = (pointer)this_00;
  websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
            (&local_78,dataHead,(span<const_std::byte,_18446744073709551615UL>)ZEXT816(0));
  msg::FunctionCall::
  encodeParameter<std::__cxx11::string&,webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             &local_78);
  msg::FunctionCall::
  encodeParameter<char_const(&)[12],webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
            (this_00,ts,&local_78);
  msg::FunctionCall::
  encodeParameter<int,webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
            (this_00,ts_1,&local_78);
  local_7a = *(key_type *)((long)this + 0x28);
  this_01 = http::std::
            map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
            ::at((map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
                  *)(*(long *)((long)this + 0x20) + 0xa8),&local_7a);
  local_50.buffers.
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.buffers.
       super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_50.buffers.
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.buffers.
       super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_50.buffers.
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.buffers.
       super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.buffers.
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.buffers.
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.buffers.
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WebLink<webfront::networking::TCPNetworkingTS>::sendFrame(this_01,&local_50);
  if (local_50.buffers.
      super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.buffers.
                    super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.buffers.
                          super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.buffers.
                          super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.buffers.
      super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.buffers.
                    super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.buffers.
                          super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.buffers.
                          super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator()(auto&&... ts) {
        command.setParametersCount(0);
        websocket::Frame<typename WebFront::Net> frame{std::span(reinterpret_cast<const std::byte*>(command.header().data()), command.header().size())};
        command.encodeParameter(name, frame);
        (((command.encodeParameter(std::forward<decltype(ts)>(ts), frame))), ...);
        
        webFront.getLink(webLinkId).sendFrame(std::move(frame));
    }